

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::RandomUniformStaticLayerParams
          (RandomUniformStaticLayerParams *this,RandomUniformStaticLayerParams *from)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__RandomUniformStaticLayerParams_0048b588;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->outputshape_,&from->outputshape_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  fVar2 = from->minval_;
  fVar3 = from->maxval_;
  this->seed_ = from->seed_;
  this->minval_ = fVar2;
  this->maxval_ = fVar3;
  return;
}

Assistant:

RandomUniformStaticLayerParams::RandomUniformStaticLayerParams(const RandomUniformStaticLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      outputshape_(from.outputshape_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&seed_, &from.seed_,
    static_cast<size_t>(reinterpret_cast<char*>(&maxval_) -
    reinterpret_cast<char*>(&seed_)) + sizeof(maxval_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.RandomUniformStaticLayerParams)
}